

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O2

void __thiscall
FIX::SocketAcceptor::onInitialize(SocketAcceptor *this,SessionSettings *sessionSettings)

{
  SessionID *__v;
  bool bVar1;
  bool bVar2;
  mapped_type_conflict1 mVar3;
  uint uVar4;
  int sendBufSize;
  int rcvBufSize;
  socket_handle socket;
  SocketServer *this_00;
  Dictionary *this_01;
  _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
  *this_02;
  mapped_type_conflict1 *pmVar5;
  bool local_13d;
  string local_120;
  string local_100;
  SessionToPort *local_e0;
  PortToSessions *local_d8;
  _Rb_tree_node_base *local_d0;
  SessionID *local_c8;
  allocator<char> local_c0 [32];
  allocator<char> local_a0 [32];
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  local_80;
  
  this_00 = (SocketServer *)operator_new(0x160);
  SocketServer::SocketServer(this_00,1);
  this->m_pServer = this_00;
  SessionSettings::getSessions
            ((set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_> *)
             &local_80,sessionSettings);
  local_d8 = &this->m_portToSessions;
  local_e0 = &this->m_sessionToPort;
  while ((_Rb_tree_header *)local_80._M_impl.super__Rb_tree_header._M_header._M_left !=
         &local_80._M_impl.super__Rb_tree_header) {
    local_c8 = (SessionID *)(local_80._M_impl.super__Rb_tree_header._M_header._M_left + 1);
    local_d0 = local_80._M_impl.super__Rb_tree_header._M_header._M_left;
    this_01 = SessionSettings::get(sessionSettings,local_c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"SocketAcceptPort",(allocator<char> *)&local_120);
    uVar4 = Dictionary::getInt(this_01,&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"SocketReuseAddress",local_c0);
    bVar1 = Dictionary::has(this_01,&local_100);
    local_13d = true;
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"SocketReuseAddress",local_a0);
      local_13d = Dictionary::getBool(this_01,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"SocketNodelay",local_c0);
    bVar1 = Dictionary::has(this_01,&local_100);
    if (bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"SocketNodelay",local_a0);
      bVar1 = Dictionary::getBool(this_01,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"SocketSendBufferSize",local_c0);
    bVar2 = Dictionary::has(this_01,&local_100);
    sendBufSize = 0;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"SocketSendBufferSize",local_a0);
      sendBufSize = Dictionary::getInt(this_01,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"SocketReceiveBufferSize",local_c0);
    bVar2 = Dictionary::has(this_01,&local_100);
    rcvBufSize = 0;
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_120,"SocketReceiveBufferSize",local_a0);
      rcvBufSize = Dictionary::getInt(this_01,&local_120);
      std::__cxx11::string::~string((string *)&local_120);
    }
    std::__cxx11::string::~string((string *)&local_100);
    socket = SocketServer::add(this->m_pServer,uVar4 & 0xffff,local_13d,bVar1,sendBufSize,rcvBufSize
                              );
    __v = local_c8;
    local_100._M_dataplus._M_p._0_2_ = socket_hostport(socket);
    this_02 = (_Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
               *)std::
                 map<unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>_>_>_>
                 ::operator[](local_d8,(key_type_conflict1 *)&local_100);
    std::
    _Rb_tree<FIX::SessionID,FIX::SessionID,std::_Identity<FIX::SessionID>,std::less<FIX::SessionID>,std::allocator<FIX::SessionID>>
    ::_M_insert_unique<FIX::SessionID_const&>(this_02,__v);
    mVar3 = socket_hostport(socket);
    pmVar5 = std::
             map<FIX::SessionID,_unsigned_short,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_unsigned_short>_>_>
             ::operator[](local_e0,__v);
    *pmVar5 = mVar3;
    local_80._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)std::_Rb_tree_increment(local_d0);
  }
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

EXCEPT(RuntimeError) {
  uint16_t port = 0;

  try {
    m_pServer = new SocketServer(1);

    for (const SessionID &sessionID : sessionSettings.getSessions()) {
      const Dictionary &settings = sessionSettings.get(sessionID);
      port = (short)settings.getInt(SOCKET_ACCEPT_PORT);

      const bool reuseAddress = settings.has(SOCKET_REUSE_ADDRESS) ? settings.getBool(SOCKET_REUSE_ADDRESS) : true;

      const bool noDelay = settings.has(SOCKET_NODELAY) ? settings.getBool(SOCKET_NODELAY) : false;

      const int sendBufSize = settings.has(SOCKET_SEND_BUFFER_SIZE) ? settings.getInt(SOCKET_SEND_BUFFER_SIZE) : 0;

      const int rcvBufSize = settings.has(SOCKET_RECEIVE_BUFFER_SIZE) ? settings.getInt(SOCKET_RECEIVE_BUFFER_SIZE) : 0;

      socket_handle acceptSocket = m_pServer->add(port, reuseAddress, noDelay, sendBufSize, rcvBufSize);
      m_portToSessions[socket_hostport(acceptSocket)].insert(sessionID);
      m_sessionToPort[sessionID] = socket_hostport(acceptSocket);
    }
  } catch (SocketException &e) {
    delete m_pServer;
    m_pServer = 0;
    throw RuntimeError(
        "Unable to create, bind, or listen to port " + IntConvertor::convert((unsigned short)port) + " (" + e.what()
        + ")");
  }
}